

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcSweptSurface::IfcSweptSurface(IfcSweptSurface *this,void **vtt)

{
  void **vtt_local;
  IfcSweptSurface *this_local;
  
  IfcSurface::IfcSurface(&this->super_IfcSurface,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSweptSurface,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcSweptSurface,_2UL> *)
             &(this->super_IfcSurface).super_IfcGeometricRepresentationItem.field_0x30,vtt + 0x10);
  (this->super_IfcSurface).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcSurface).super_IfcGeometricRepresentationItem.
                    super_IfcRepresentationItem.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                    _vptr_ObjectHelper +
            (long)(this->super_IfcSurface).super_IfcGeometricRepresentationItem.
                  super_IfcRepresentationItem.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                  _vptr_ObjectHelper[-3]) = vtt[0x12];
  *(void **)&(this->super_IfcSurface).super_IfcGeometricRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       vtt[0x13];
  *(void **)&(this->super_IfcSurface).super_IfcGeometricRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       vtt[0x14];
  *(void **)&(this->super_IfcSurface).super_IfcGeometricRepresentationItem.field_0x30 = vtt[0x15];
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef> *)&(this->super_IfcSurface).field_0x40,
             (LazyObject *)0x0);
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>::Lazy(&this->Position,(LazyObject *)0x0);
  return;
}

Assistant:

IfcSweptSurface() : Object("IfcSweptSurface") {}